

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_remove_element(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  ulong uVar5;
  size_t new_ele_cnt;
  size_t idx;
  vm_val_t *v;
  vm_val_t ele_val;
  
  if (getp_remove_element(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar4 = __cxa_guard_acquire(&getp_remove_element(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar4 != 0) {
      getp_remove_element::desc.min_argc_ = 1;
      getp_remove_element::desc.opt_argc_ = 0;
      getp_remove_element::desc.varargs_ = 0;
      __cxa_guard_release(&getp_remove_element(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_remove_element::desc);
  if (iVar4 == 0) {
    v = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    pvVar3 = sp_;
    uVar2 = *(undefined4 *)&retval->field_0x4;
    aVar1 = retval->val;
    sp_ = sp_ + 1;
    pvVar3->typ = retval->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    uVar5 = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    new_ele_cnt = 0;
    for (idx = 0; uVar5 != idx; idx = idx + 1) {
      get_element(this,idx,&ele_val);
      iVar4 = vm_val_t::equals(&ele_val,v,0);
      if (iVar4 == 0) {
        if (idx != new_ele_cnt) {
          set_element_undo(this,self,new_ele_cnt,&ele_val);
        }
        new_ele_cnt = new_ele_cnt + 1;
      }
    }
    if (new_ele_cnt != uVar5) {
      set_element_count_undo(this,self,new_ele_cnt);
    }
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_remove_element(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc)
{
    vm_val_t *del_val;
    static CVmNativeCodeDesc desc(1);
    size_t src;
    size_t dst;
    size_t old_cnt;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value to be removed */
    del_val = G_stk->get(0);

    /* the return value is 'self'; leave it on the stack */
    retval->set_obj(self);
    G_stk->push(retval);

    /* get the original number of elements */
    old_cnt = get_element_count();

    /* delete each element matching the given value */
    for (src = dst = 0 ; src < old_cnt ; ++src)
    {
        vm_val_t ele_val;

        /* get this element */
        get_element(src, &ele_val);

        /* 
         *   if this element doesn't match the value to be deleted, add it
         *   to the result vector 
         */
        if (!ele_val.equals(vmg_ del_val))
        {
            /* 
             *   This element is a keeper - if we're moving it to a new
             *   position (i.e., we've deleted any elements before this
             *   one), store it at its new position, keeping undo
             *   information.  If we're storing it at its same position,
             *   there's no need to re-store the value or keep any undo,
             *   since no change is involved.  
             */
            if (dst != src)
                set_element_undo(vmg_ self, dst, &ele_val);

            /* increment the write index past this element */
            ++dst;
        }
    }

    /* if the element count changed, set the new element count */
    if (dst != old_cnt)
        set_element_count_undo(vmg_ self, dst);

    /* discard gc protection and arguments */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}